

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cut.cpp
# Opt level: O3

int dfs_dinic(int v,int t,int flow)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  iVar3 = 0;
  if ((flow != 0) && (iVar3 = flow, v != t)) {
    lVar10 = (long)v;
    iVar5 = *(int *)((anonymous_namespace)::ptr + lVar10 * 4);
    lVar9 = *(long *)((anonymous_namespace)::edges_dup + lVar10 * 0x18);
    lVar4 = (anonymous_namespace)::edgelist;
    lVar6 = (anonymous_namespace)::edges_dup;
    lVar7 = (anonymous_namespace)::dis;
    lVar8 = (anonymous_namespace)::ptr;
    iVar3 = 0;
    if (iVar5 < (int)((ulong)(*(long *)((anonymous_namespace)::edges_dup + 8 + lVar10 * 0x18) -
                             lVar9) >> 2)) {
      do {
        uVar2 = *(uint *)(lVar9 + (long)iVar5 * 4);
        lVar9 = (long)(int)uVar2 * 0x10;
        iVar3 = *(int *)(lVar4 + 4 + lVar9);
        if (*(int *)(lVar7 + (long)iVar3 * 4) == *(int *)(lVar7 + lVar10 * 4) + 1) {
          iVar5 = *(int *)(lVar4 + lVar9 + 8) - *(int *)(lVar4 + lVar9 + 0xc);
          if (flow <= iVar5) {
            iVar5 = flow;
          }
          iVar3 = dfs_dinic(iVar3,t,iVar5);
          lVar4 = (anonymous_namespace)::edgelist;
          lVar6 = (anonymous_namespace)::edges_dup;
          lVar7 = (anonymous_namespace)::dis;
          lVar8 = (anonymous_namespace)::ptr;
          if (iVar3 != 0) {
            piVar1 = (int *)((anonymous_namespace)::edgelist + 0xc + lVar9);
            *piVar1 = *piVar1 + iVar3;
            piVar1 = (int *)(lVar4 + 0xc + (long)(int)(uVar2 ^ 1) * 0x10);
            *piVar1 = *piVar1 - iVar3;
            return iVar3;
          }
        }
        iVar5 = *(int *)(lVar8 + lVar10 * 4) + 1;
        *(int *)(lVar8 + lVar10 * 4) = iVar5;
        lVar9 = *(long *)(lVar6 + lVar10 * 0x18);
      } while (iVar5 < (int)((ulong)(*(long *)(lVar6 + 8 + lVar10 * 0x18) - lVar9) >> 2));
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int dfs_dinic(int v, int t, int flow) {
    if (!flow) {
        return 0;
    }
    
    if (v == t) {
        return flow;
    }
    
    for (; ptr[v] < (int) edges_dup[v].size(); ptr[v]++) {
        int ind = edges_dup[v][ptr[v]];
        int next = edgelist[ind].b;
        
        if (dis[next] != dis[v] + 1) {
            continue;
        }
        
        int pushed = dfs_dinic(next, t, min(flow, edgelist[ind].c - edgelist[ind].flow));
        
        if (pushed) {
            edgelist[ind].flow += pushed;
            edgelist[ind ^ 1].flow -= pushed;
            return pushed;
        }
    }
    
    return 0;
}